

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O0

void __thiscall ScopedMetric::~ScopedMetric(ScopedMetric *this)

{
  int64_t iVar1;
  int64_t dt;
  ScopedMetric *this_local;
  
  if (this->metric_ != (Metric *)0x0) {
    this->metric_->count = this->metric_->count + 1;
    iVar1 = anon_unknown.dwarf_15b7cb::HighResTimer();
    iVar1 = anon_unknown.dwarf_15b7cb::TimerToMicros(iVar1 - this->start_);
    this->metric_->sum = iVar1 + this->metric_->sum;
  }
  return;
}

Assistant:

ScopedMetric::~ScopedMetric() {
  if (!metric_)
    return;
  metric_->count++;
  int64_t dt = TimerToMicros(HighResTimer() - start_);
  metric_->sum += dt;
}